

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getvariable.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindGetVariableExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  FunctionData *pFVar1;
  BoundConstantExpression *this_00;
  InternalException *this_01;
  Value local_60;
  
  if ((input->bind_data).ptr != (FunctionData *)0x0) {
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
    pFVar1 = (input->bind_data).ptr;
    this_00 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_60,(Value *)(pFVar1 + 1));
    BoundConstantExpression::BoundConstantExpression(this_00,&local_60);
    Value::~Value(&local_60);
    *(BoundConstantExpression **)this = this_00;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_60.type_._0_8_ = (long)&local_60 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"input.bind_data should be set","");
  InternalException::InternalException(this_01,(string *)&local_60);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> BindGetVariableExpression(FunctionBindExpressionInput &input) {
	if (!input.bind_data) {
		// unknown type
		throw InternalException("input.bind_data should be set");
	}
	auto &bind_data = input.bind_data->Cast<GetVariableBindData>();
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(bind_data.value);
}